

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.cc
# Opt level: O1

bool __thiscall
draco::DirectBitDecoder::StartDecoding(DirectBitDecoder *this,DecoderBuffer *source_buffer)

{
  long lVar1;
  uint uVar2;
  pointer puVar3;
  ulong __n;
  
  puVar3 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  this->num_used_bits_ = 0;
  (this->pos_)._M_current =
       (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar1 = source_buffer->pos_ + 4;
  if (lVar1 <= source_buffer->data_size_) {
    uVar2 = *(uint *)(source_buffer->data_ + source_buffer->pos_);
    __n = (ulong)uVar2;
    source_buffer->pos_ = lVar1;
    if (((uVar2 & 3) == 0 && uVar2 != 0) &&
       ((long)__n <= source_buffer->data_size_ - source_buffer->pos_)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->bits_,(ulong)(uVar2 >> 2));
      lVar1 = source_buffer->pos_ + __n;
      if (source_buffer->data_size_ < lVar1) {
        return lVar1 <= source_buffer->data_size_;
      }
      memcpy((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,source_buffer->data_ + source_buffer->pos_,__n);
      source_buffer->pos_ = source_buffer->pos_ + __n;
      (this->pos_)._M_current =
           (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      this->num_used_bits_ = 0;
      return true;
    }
  }
  return false;
}

Assistant:

bool DirectBitDecoder::StartDecoding(DecoderBuffer *source_buffer) {
  Clear();
  uint32_t size_in_bytes;
  if (!source_buffer->Decode(&size_in_bytes)) {
    return false;
  }

  // Check that size_in_bytes is > 0 and a multiple of 4 as the encoder always
  // encodes 32 bit elements.
  if (size_in_bytes == 0 || size_in_bytes & 0x3) {
    return false;
  }
  if (size_in_bytes > source_buffer->remaining_size()) {
    return false;
  }
  const uint32_t num_32bit_elements = size_in_bytes / 4;
  bits_.resize(num_32bit_elements);
  if (!source_buffer->Decode(bits_.data(), size_in_bytes)) {
    return false;
  }
  pos_ = bits_.begin();
  num_used_bits_ = 0;
  return true;
}